

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_MappingRef::Write(ON_MappingRef *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_19;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_MappingRef *this_local;
  
  local_19 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (local_19) {
    if (local_19) {
      local_19 = ON_BinaryArchive::WriteUuid(archive,&this->m_plugin_id);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteArray(archive,&this->m_mapping_channels);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    if (!bVar1) {
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool ON_MappingRef::Write( ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 1, 0 );
  if (rc)
  {
    if (rc) rc = archive.WriteUuid( m_plugin_id );
    if (rc) rc = archive.WriteArray( m_mapping_channels );

    if ( !archive.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}